

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfConvert.cpp
# Opt level: O3

uint Imf_3_4::floatToUint(float f)

{
  uint uVar1;
  
  uVar1 = 0;
  if ((uint)f < 0x7f800001) {
    uVar1 = (uint)(long)f;
    if (4.2949673e+09 < f) {
      uVar1 = 0xffffffff;
    }
    if (INFINITY <= f) {
      uVar1 = 0xffffffff;
    }
  }
  return uVar1;
}

Assistant:

inline bool
isNegative (float f)
{
    union
    {
        float f;
        int   i;
    } u;
    u.f = f;
    return (u.i & 0x80000000) != 0;
}